

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_thisSymbolValue(JSContext *ctx,JSValue this_val)

{
  bool bVar1;
  int64_t iVar2;
  JSValueUnion unaff_RBX;
  JSRefCountHeader *p;
  JSValueUnion JVar3;
  JSValue JVar4;
  
  iVar2 = this_val.tag;
  JVar3 = this_val.u;
  if ((int)this_val.tag == -1) {
    bVar1 = true;
    if ((*(short *)((long)JVar3.ptr + 6) == 7) &&
       (iVar2 = *(int64_t *)((long)JVar3.ptr + 0x38), (int)iVar2 == -8)) {
      unaff_RBX = (JSValueUnion)((JSValueUnion *)((long)JVar3.ptr + 0x30))->ptr;
      *(int *)unaff_RBX.ptr = *unaff_RBX.ptr + 1;
      bVar1 = false;
    }
    if (!bVar1) goto LAB_0016d731;
  }
  else if ((int)this_val.tag == -8) {
    *(int *)JVar3.ptr = *JVar3.ptr + 1;
    unaff_RBX = JVar3;
    goto LAB_0016d731;
  }
  unaff_RBX.float64 = 0.0;
  JS_ThrowTypeError(ctx,"not a symbol");
  iVar2 = 6;
LAB_0016d731:
  JVar4.tag = iVar2;
  JVar4.u.ptr = unaff_RBX.ptr;
  return JVar4;
}

Assistant:

static JSValue js_thisSymbolValue(JSContext *ctx, JSValueConst this_val)
{
    if (JS_VALUE_GET_TAG(this_val) == JS_TAG_SYMBOL)
        return JS_DupValue(ctx, this_val);

    if (JS_VALUE_GET_TAG(this_val) == JS_TAG_OBJECT) {
        JSObject *p = JS_VALUE_GET_OBJ(this_val);
        if (p->class_id == JS_CLASS_SYMBOL) {
            if (JS_VALUE_GET_TAG(p->u.object_data) == JS_TAG_SYMBOL)
                return JS_DupValue(ctx, p->u.object_data);
        }
    }
    return JS_ThrowTypeError(ctx, "not a symbol");
}